

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  bool bVar1;
  NamePattern *this_00;
  ExcludedPattern *this_01;
  allocator<char> local_59;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  
  subString_abi_cxx11_(&token,this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&pattern,"exclude:",&local_59);
  bVar1 = startsWith(&token,(string *)&pattern);
  std::__cxx11::string::~string((string *)&pattern);
  if (bVar1) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&pattern,(ulong)&token);
    std::__cxx11::string::operator=((string *)&token,(string *)&pattern);
    std::__cxx11::string::~string((string *)&pattern);
  }
  if (token._M_string_length != 0) {
    this_00 = (NamePattern *)operator_new(0x40);
    TestSpec::NamePattern::NamePattern(this_00,&token);
    pattern.m_p = (Pattern *)this_00;
    (*(this_00->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])(this_00);
    if (this->m_exclusion == true) {
      this_01 = (ExcludedPattern *)operator_new(0x18);
      TestSpec::ExcludedPattern::ExcludedPattern(this_01,&pattern);
      Ptr<Catch::TestSpec::Pattern>::operator=(&pattern,(Pattern *)this_01);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&pattern);
    Ptr<Catch::TestSpec::Pattern>::~Ptr(&pattern);
  }
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)&token);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }